

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

void __thiscall
CMU462::Camera::place
          (Camera *this,Vector3D *targetPos,double phi,double theta,double r,double minR,double maxR
          )

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = minR;
  if (minR <= r) {
    dVar2 = r;
  }
  dVar3 = maxR;
  if (dVar2 <= maxR) {
    dVar3 = dVar2;
  }
  dVar2 = sin(phi);
  dVar1 = targetPos->y;
  (this->targetPos).x = targetPos->x;
  (this->targetPos).y = dVar1;
  (this->targetPos).z = targetPos->z;
  this->phi = (double)(~-(ulong)(dVar2 == 0.0) & (ulong)phi |
                      (ulong)(phi + 9.999999747378752e-06) & -(ulong)(dVar2 == 0.0));
  this->theta = theta;
  this->r = dVar3;
  this->minR = minR;
  this->maxR = maxR;
  compute_position(this);
  return;
}

Assistant:

void Camera::place(const Vector3D& targetPos, const double phi,
                   const double theta, const double r, const double minR,
                   const double maxR) {
  double r_ = min(max(r, minR), maxR);
  double phi_ = (sin(phi) == 0) ? (phi + EPS_F) : phi;
  this->targetPos = targetPos;
  this->phi = phi_;
  this->theta = theta;
  this->r = r_;
  this->minR = minR;
  this->maxR = maxR;
  compute_position();
}